

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfedge.cpp
# Opt level: O0

void __thiscall
graphics101::HalfEdgeTriMesh::vertex_face_neighbors
          (HalfEdgeTriMesh *this,Index vertex_index,Indices *result)

{
  Indices *result_local;
  Index vertex_index_local;
  HalfEdgeTriMesh *this_local;
  
  std::vector<long,_std::allocator<long>_>::clear(result);
  return;
}

Assistant:

void HalfEdgeTriMesh::vertex_face_neighbors( const Index vertex_index, Indices& result ) const
{
    result.clear();

    // Your code goes here.
    
    // Outline:
    // 1 Get the outgoing half-edge index for the vertex.
    // 2 Start the iteration at that half-edge index.
    // 3 Get the HalfEdge for the half-edge index.
    // 4 Store the face the half-edge points to if it's not -1.
    //   Call result.push_back() with each face index.
    //   To handle boundaries, don't .push_back() if the face index == -1.
    // 5 Increment to the next face.
    // 6 If we are back where we started, we've seen all vertices.
    
    
}